

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  long lVar1;
  LRUHandle *pLVar2;
  int iVar3;
  size_t in_RCX;
  undefined4 in_register_00000014;
  uint in_R8D;
  LRUHandle **ppLVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppLVar4 = (LRUHandle **)(&key->data_ + ((int)this - 1U & in_R8D));
  for (pLVar2 = *ppLVar4; pLVar2 != (LRUHandle *)0x0; pLVar2 = pLVar2->next_hash) {
    if (pLVar2->hash == in_R8D) {
      if (pLVar2->next == pLVar2) {
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      if ((pLVar2->key_length == in_RCX) &&
         (iVar3 = bcmp((void *)CONCAT44(in_register_00000014,hash),pLVar2->key_data,in_RCX),
         iVar3 == 0)) break;
    }
    ppLVar4 = &pLVar2->next_hash;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ppLVar4;
  }
  __stack_chk_fail();
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }